

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btcp.c
# Opt level: O2

void nn_btcp_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  nn_fsm *pnVar1;
  nn_list_item *it;
  ulong uVar2;
  char *pcVar3;
  ulong uVar4;
  undefined8 uVar5;
  
  uVar4 = (ulong)(uint)src;
  uVar2 = (ulong)*(uint *)&self[1].fn;
  switch(*(uint *)&self[1].fn) {
  case 1:
    if (src == -2) {
      if (type == -2) {
LAB_001245f3:
        nn_btcp_start_listening((nn_btcp *)self);
        return;
      }
      pcVar3 = "Unexpected action";
      uVar2 = 1;
      uVar4 = 0xfffffffffffffffe;
      uVar5 = 0x129;
    }
    else {
      pcVar3 = "Unexpected source";
      uVar2 = 1;
      uVar5 = 0x12d;
    }
    break;
  case 2:
    pnVar1 = self[8].owner;
    if (pnVar1 == (nn_fsm *)srcptr) {
      if (type == 0x85b7) {
        it = nn_list_end((nn_list *)&self[8].ctx);
        nn_list_insert((nn_list *)&self[8].ctx,(nn_list_item *)&pnVar1[0x14].stopped.item,it);
        self[8].owner = (nn_fsm *)0x0;
        nn_btcp_start_accepting((nn_btcp *)self);
        return;
      }
      pcVar3 = "Unexpected action";
      uVar2 = 2;
      uVar5 = 0x145;
    }
    else {
      if (src != 2) {
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","src == NN_BTCP_SRC_ATCP",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/tcp/btcp.c"
                ,0x14b);
        goto LAB_00124732;
      }
      if (type == 0x85b9) {
        nn_list_erase((nn_list *)&self[8].ctx,(nn_list_item *)((long)srcptr + 0x730));
        nn_atcp_term((nn_atcp *)srcptr);
        nn_free(srcptr);
        return;
      }
      if (type == 0x85b8) {
        nn_atcp_stop((nn_atcp *)srcptr);
        return;
      }
      pcVar3 = "Unexpected action";
      uVar2 = 2;
      uVar4 = 2;
      uVar5 = 0x157;
    }
    break;
  default:
    pcVar3 = "Unexpected state";
    uVar5 = 0x19f;
    break;
  case 7:
    if (src == 3) {
      if (type == 1) {
        nn_backoff_stop((nn_backoff *)&self[8].stopped.src);
        *(undefined4 *)&self[1].fn = 9;
        return;
      }
      pcVar3 = "Unexpected action";
      uVar2 = 7;
      uVar4 = 3;
      uVar5 = 0x180;
    }
    else {
      pcVar3 = "Unexpected source";
      uVar2 = 7;
      uVar5 = 0x184;
    }
    break;
  case 8:
    if (src == 1) {
      if (type == 8) {
        return;
      }
      if (type == 7) {
        nn_backoff_start((nn_backoff *)&self[8].stopped.src);
        *(undefined4 *)&self[1].fn = 7;
        return;
      }
      pcVar3 = "Unexpected action";
      uVar2 = 8;
      uVar4 = 1;
      uVar5 = 0x16a;
    }
    else {
      pcVar3 = "Unexpected source";
      uVar2 = 8;
      uVar5 = 0x16e;
    }
    break;
  case 9:
    if (src == 3) {
      if (type == 2) goto LAB_001245f3;
      pcVar3 = "Unexpected action";
      uVar2 = 9;
      uVar4 = 3;
      uVar5 = 0x194;
    }
    else {
      pcVar3 = "Unexpected source";
      uVar2 = 9;
      uVar5 = 0x198;
    }
  }
  fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n",pcVar3,uVar2,uVar4,(ulong)(uint)type,
          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/tcp/btcp.c"
          ,uVar5);
LAB_00124732:
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static void nn_btcp_handler (struct nn_fsm *self, int src, int type,
    void *srcptr)
{
    struct nn_btcp *btcp;
    struct nn_atcp *atcp;

    btcp = nn_cont (self, struct nn_btcp, fsm);

    switch (btcp->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/******************************************************************************/
    case NN_BTCP_STATE_IDLE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_FSM_START:
                nn_btcp_start_listening (btcp);
                return;
            default:
                nn_fsm_bad_action (btcp->state, src, type);
            }

        default:
            nn_fsm_bad_source (btcp->state, src, type);
        }

/******************************************************************************/
/*  ACTIVE state.                                                             */
/*  The execution is yielded to the atcp state machine in this state.         */
/******************************************************************************/
    case NN_BTCP_STATE_ACTIVE:
        if (srcptr == btcp->atcp) {
            switch (type) {
            case NN_ATCP_ACCEPTED:

                /*  Move the newly created connection to the list of existing
                    connections. */
                nn_list_insert (&btcp->atcps, &btcp->atcp->item,
                    nn_list_end (&btcp->atcps));
                btcp->atcp = NULL;

                /*  Start waiting for a new incoming connection. */
                nn_btcp_start_accepting (btcp);

                return;

            default:
                nn_fsm_bad_action (btcp->state, src, type);
            }
        }

        /*  For all remaining events we'll assume they are coming from one
            of remaining child atcp objects. */
        nn_assert (src == NN_BTCP_SRC_ATCP);
        atcp = (struct nn_atcp*) srcptr;
        switch (type) {
        case NN_ATCP_ERROR:
            nn_atcp_stop (atcp);
            return;
        case NN_ATCP_STOPPED:
            nn_list_erase (&btcp->atcps, &atcp->item);
            nn_atcp_term (atcp);
            nn_free (atcp);
            return;
        default:
            nn_fsm_bad_action (btcp->state, src, type);
        }

/******************************************************************************/
/*  CLOSING_USOCK state.                                                     */
/*  usock object was asked to stop but it haven't stopped yet.                */
/******************************************************************************/
    case NN_BTCP_STATE_CLOSING:
        switch (src) {

        case NN_BTCP_SRC_USOCK:
            switch (type) {
            case NN_USOCK_SHUTDOWN:
                return;
            case NN_USOCK_STOPPED:
                nn_backoff_start (&btcp->retry);
                btcp->state = NN_BTCP_STATE_WAITING;
                return;
            default:
                nn_fsm_bad_action (btcp->state, src, type);
            }

        default:
            nn_fsm_bad_source (btcp->state, src, type);
        }

/******************************************************************************/
/*  WAITING state.                                                            */
/*  Waiting before re-bind is attempted. This way we won't overload           */
/*  the system by continuous re-bind attemps.                                 */
/******************************************************************************/
    case NN_BTCP_STATE_WAITING:
        switch (src) {

        case NN_BTCP_SRC_RECONNECT_TIMER:
            switch (type) {
            case NN_BACKOFF_TIMEOUT:
                nn_backoff_stop (&btcp->retry);
                btcp->state = NN_BTCP_STATE_STOPPING_BACKOFF;
                return;
            default:
                nn_fsm_bad_action (btcp->state, src, type);
            }

        default:
            nn_fsm_bad_source (btcp->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_BACKOFF state.                                                   */
/*  backoff object was asked to stop, but it haven't stopped yet.             */
/******************************************************************************/
    case NN_BTCP_STATE_STOPPING_BACKOFF:
        switch (src) {

        case NN_BTCP_SRC_RECONNECT_TIMER:
            switch (type) {
            case NN_BACKOFF_STOPPED:
                nn_btcp_start_listening (btcp);
                return;
            default:
                nn_fsm_bad_action (btcp->state, src, type);
            }

        default:
            nn_fsm_bad_source (btcp->state, src, type);
        }

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (btcp->state, src, type);
    }
}